

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O0

void __thiscall Timer::Timer(Timer *this)

{
  Timer *this_local;
  memory_order __b;
  
  std::
  priority_queue<Timer::TimerNode,std::vector<Timer::TimerNode,std::allocator<Timer::TimerNode>>,std::less<Timer::TimerNode>>
  ::priority_queue<std::vector<Timer::TimerNode,std::allocator<Timer::TimerNode>>,void>
            ((priority_queue<Timer::TimerNode,std::vector<Timer::TimerNode,std::allocator<Timer::TimerNode>>,std::less<Timer::TimerNode>>
              *)this);
  std::atomic<bool>::atomic(&this->tm_running);
  std::mutex::mutex(&this->tm_mutex);
  std::condition_variable::condition_variable(&this->tm_cond);
  std::thread::thread(&this->tm_tick_thread);
  Threadpool::Threadpool(&this->tm_thread_pool,2);
  std::atomic<int>::atomic(&this->tm_id);
  hash_map<int,_Timer::IdState>::hash_map(&this->tm_id_state_map);
  std::operator&(seq_cst,__memory_order_mask);
  LOCK();
  (this->tm_id).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  std::atomic<bool>::store(&this->tm_running,true,seq_cst);
  return;
}

Assistant:

Timer() : tm_thread_pool(DEFAULT_TIMER_THREAD_POOL_SIZE) {
// cout <<"create timer" <<endl;
        tm_id.store(0);
        tm_running.store(true);
    }